

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.cpp
# Opt level: O2

int __thiscall ncnn::Cast::forward(Cast *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int _d;
  uint _c;
  int *piVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  unsigned_short uVar6;
  int iVar7;
  int iVar8;
  void *pvVar9;
  ulong uVar10;
  int iVar11;
  size_t sVar12;
  ulong uVar13;
  void *pvVar14;
  int i_2;
  ulong uVar15;
  int i;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  float fVar19;
  
  if (this->type_from == this->type_to) {
    iVar11 = 0;
    if (top_blob != bottom_blob) {
      piVar2 = bottom_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = top_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            free(top_blob->data);
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->c = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      piVar2 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar2;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar7 = bottom_blob->w;
      iVar8 = bottom_blob->h;
      iVar1 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar7;
      top_blob->h = iVar8;
      top_blob->d = iVar1;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
    }
  }
  else {
    iVar7 = bottom_blob->elempack;
    sVar12 = (size_t)iVar7;
    switch(this->type_to) {
    case 1:
      sVar12 = sVar12 * 4;
      break;
    case 2:
    case 4:
      sVar12 = (size_t)(iVar7 * 2);
      break;
    case 3:
      break;
    default:
      sVar12 = bottom_blob->elemsize;
    }
    iVar8 = bottom_blob->w;
    iVar1 = bottom_blob->h;
    _d = bottom_blob->d;
    _c = bottom_blob->c;
    uVar10 = (ulong)_c;
    switch(bottom_blob->dims) {
    case 1:
      Mat::create(top_blob,iVar8,sVar12,iVar7,opt->blob_allocator);
      break;
    case 2:
      Mat::create(top_blob,iVar8,iVar1,sVar12,iVar7,opt->blob_allocator);
      break;
    case 3:
      Mat::create(top_blob,iVar8,iVar1,_c,sVar12,iVar7,opt->blob_allocator);
      break;
    case 4:
      Mat::create(top_blob,iVar8,iVar1,_d,_c,sVar12,iVar7,opt->blob_allocator);
    }
    iVar11 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar18 = _d * iVar7 * iVar1 * iVar8;
      iVar7 = this->type_from;
      iVar8 = this->type_to;
      if (iVar8 == 2 && iVar7 == 1) {
        uVar16 = 0;
        uVar13 = 0;
        if (0 < (int)uVar18) {
          uVar13 = (ulong)uVar18;
        }
        uVar15 = 0;
        if (0 < (int)_c) {
          uVar15 = uVar10;
        }
        for (; uVar16 != uVar15; uVar16 = uVar16 + 1) {
          sVar12 = bottom_blob->cstep;
          sVar3 = top_blob->cstep;
          sVar4 = top_blob->elemsize;
          pvVar9 = top_blob->data;
          sVar5 = bottom_blob->elemsize;
          pvVar14 = bottom_blob->data;
          for (uVar17 = 0; uVar13 != uVar17; uVar17 = uVar17 + 1) {
            uVar6 = float32_to_float16(*(float *)((long)pvVar14 +
                                                 uVar17 * 4 + sVar12 * sVar5 * uVar16));
            *(unsigned_short *)((long)pvVar9 + uVar17 * 2 + sVar3 * sVar4 * uVar16) = uVar6;
          }
        }
        iVar7 = this->type_from;
        iVar8 = this->type_to;
      }
      if (iVar8 == 1 && iVar7 == 2) {
        uVar16 = 0;
        uVar13 = 0;
        if (0 < (int)uVar18) {
          uVar13 = (ulong)uVar18;
        }
        uVar15 = 0;
        if (0 < (int)_c) {
          uVar15 = uVar10;
        }
        for (; uVar16 != uVar15; uVar16 = uVar16 + 1) {
          sVar12 = bottom_blob->cstep;
          sVar3 = top_blob->cstep;
          sVar4 = top_blob->elemsize;
          pvVar9 = top_blob->data;
          sVar5 = bottom_blob->elemsize;
          pvVar14 = bottom_blob->data;
          for (uVar17 = 0; uVar13 != uVar17; uVar17 = uVar17 + 1) {
            fVar19 = float16_to_float32(*(unsigned_short *)
                                         ((long)pvVar14 + uVar17 * 2 + sVar12 * sVar5 * uVar16));
            *(float *)((long)pvVar9 + uVar17 * 4 + sVar3 * sVar4 * uVar16) = fVar19;
          }
        }
        iVar7 = this->type_from;
        iVar8 = this->type_to;
      }
      if ((iVar7 == 3) && (iVar8 == 1)) {
        pvVar9 = bottom_blob->data;
        sVar12 = bottom_blob->cstep;
        sVar3 = top_blob->cstep;
        sVar4 = top_blob->elemsize;
        pvVar14 = top_blob->data;
        uVar13 = 0;
        uVar16 = 0;
        if (0 < (int)uVar18) {
          uVar16 = (ulong)uVar18;
        }
        uVar15 = 0;
        if (0 < (int)_c) {
          uVar15 = uVar10;
        }
        sVar5 = bottom_blob->elemsize;
        for (; uVar13 != uVar15; uVar13 = uVar13 + 1) {
          for (uVar17 = 0; uVar16 != uVar17; uVar17 = uVar17 + 1) {
            *(float *)((long)pvVar14 + uVar17 * 4) = (float)(int)*(char *)((long)pvVar9 + uVar17);
          }
          pvVar14 = (void *)((long)pvVar14 + sVar3 * sVar4);
          pvVar9 = (void *)((long)pvVar9 + sVar12 * sVar5);
        }
        iVar8 = this->type_to;
      }
      if ((iVar7 == 1) && (iVar8 == 4)) {
        pvVar9 = bottom_blob->data;
        sVar12 = bottom_blob->cstep;
        sVar3 = top_blob->cstep;
        sVar4 = top_blob->elemsize;
        pvVar14 = top_blob->data;
        uVar13 = 0;
        uVar16 = 0;
        if (0 < (int)uVar18) {
          uVar16 = (ulong)uVar18;
        }
        uVar15 = 0;
        if (0 < (int)_c) {
          uVar15 = uVar10;
        }
        sVar5 = bottom_blob->elemsize;
        for (; uVar13 != uVar15; uVar13 = uVar13 + 1) {
          for (uVar17 = 0; uVar16 != uVar17; uVar17 = uVar17 + 1) {
            *(undefined2 *)((long)pvVar14 + uVar17 * 2) =
                 *(undefined2 *)((long)pvVar9 + uVar17 * 4 + 2);
          }
          pvVar14 = (void *)((long)pvVar14 + sVar3 * sVar4);
          pvVar9 = (void *)((long)pvVar9 + sVar12 * sVar5);
        }
        iVar8 = this->type_to;
      }
      iVar11 = 0;
      if ((iVar7 == 4) && (iVar8 == 1)) {
        pvVar9 = bottom_blob->data;
        sVar12 = top_blob->cstep;
        sVar3 = top_blob->elemsize;
        iVar11 = 0;
        uVar13 = (ulong)uVar18;
        if ((int)uVar18 < 1) {
          uVar13 = 0;
        }
        sVar4 = bottom_blob->cstep;
        if ((int)_c < 1) {
          uVar10 = 0;
        }
        pvVar14 = top_blob->data;
        sVar5 = bottom_blob->elemsize;
        for (uVar16 = 0; uVar16 != uVar10; uVar16 = uVar16 + 1) {
          for (uVar15 = 0; uVar13 != uVar15; uVar15 = uVar15 + 1) {
            *(uint *)((long)pvVar14 + uVar15 * 4) =
                 (uint)*(ushort *)((long)pvVar9 + uVar15 * 2) << 0x10;
          }
          pvVar14 = (void *)((long)pvVar14 + sVar12 * sVar3);
          pvVar9 = (void *)((long)pvVar9 + sVar4 * sVar5);
        }
      }
    }
  }
  return iVar11;
}

Assistant:

int Cast::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            unsigned short* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = float32_to_float16(ptr[i]);
            }
        }
    }

    if (type_from == 2 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const unsigned short* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = float16_to_float32(ptr[i]);
            }
        }
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            unsigned short* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = float32_to_bfloat16(ptr[i]);
            }
        }
    }

    if (type_from == 4 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const unsigned short* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = bfloat16_to_float32(ptr[i]);
            }
        }
    }

    // TODO more cast type

    return 0;
}